

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

void dump_info(ostream *os,char *name,char *txt)

{
  long lVar1;
  size_t sVar2;
  
  lVar1 = std::cout;
  *(uint *)(explode::unpklite::data_offset + *(long *)(std::cout + -0x18)) =
       *(uint *)(explode::unpklite::data_offset + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
  *(undefined8 *)(std::ios_base::Init::Init + *(long *)(lVar1 + -0x18)) = 0x20;
  if (os == (ostream *)0x0) {
    std::ios::clear((int)*(undefined8 *)(lVar1 + -0x18) + 0x1070f8);
  }
  else {
    sVar2 = strlen((char *)os);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)os,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":\t",2);
  if (name == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1070f8);
  }
  else {
    sVar2 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,name,sVar2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  return;
}

Assistant:

PRIVATE void dump_info(std::ostream& os, const char* name, const char* txt)
{
	os << std::left << std::setw(32) << name << ":\t" << txt << std::endl;
}